

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O0

bool tcu::anon_unknown_3::verifyLineGroupPixelIndependentInterpolation
               (Surface *surface,LineSceneSpec *scene,RasterizationArguments *args,TestLog *log,
               LineInterpolationMethod interpolationMethod)

{
  pointer *ppSVar1;
  RGBA RVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  MessageBuilder *pMVar6;
  uint *puVar7;
  const_reference pvVar8;
  reference pvVar9;
  IVec3 *pIVar10;
  Vec3 *pVVar11;
  TestLog *pTVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  bool local_12aa;
  allocator<char> local_1241;
  string local_1240;
  allocator<char> local_1219;
  string local_1218;
  LogImage local_11f8;
  allocator<char> local_1161;
  string local_1160;
  allocator<char> local_1139;
  string local_1138;
  LogImageSet local_1118;
  MessageBuilder local_10d8;
  allocator<char> local_f51;
  string local_f50;
  allocator<char> local_f29;
  string local_f28;
  LogImage local_f08;
  allocator<char> local_e71;
  string local_e70;
  allocator<char> local_e49;
  string local_e48;
  LogImage local_e28;
  allocator<char> local_d91;
  string local_d90;
  allocator<char> local_d69;
  string local_d68;
  LogImageSet local_d48;
  MessageBuilder local_d08;
  int local_b84;
  MessageBuilder local_b80;
  Vector<float,_3> local_a00;
  Vector<float,_3> local_9f4;
  Vector<float,_3> local_9e8;
  Vector<float,_3> local_9dc;
  Vector<float,_3> local_9d0;
  Vector<float,_3> local_9c4;
  Vector<float,_3> local_9b8;
  Vector<float,_3> local_9ac;
  Vector<float,_3> local_9a0;
  Vector<float,_3> local_994;
  Vector<float,_3> local_988;
  Vector<float,_3> local_97c;
  Vector<int,_3> local_970;
  Vector<int,_3> local_964;
  Vector<int,_3> local_958;
  Vector<int,_3> local_94c;
  MessageBuilder local_940;
  reference local_7c0;
  SingleSampleNarrowLineCandidate *candidate_1;
  int candidateNdx;
  int local_62c;
  undefined1 local_628 [20];
  float local_614;
  undefined1 local_610 [8];
  SingleSampleNarrowLineCandidate candidate;
  IVec3 colorMax;
  IVec3 colorMin;
  Vec3 colorMaxF;
  Vec3 colorMinF;
  Vector<float,_4> local_584;
  undefined1 local_574 [8];
  Vec4 valueMax;
  Vector<float,_4> local_554;
  undefined1 local_544 [8];
  Vec4 valueMin;
  Vector<int,_2> local_52c;
  Vector<float,_2> local_524;
  LineInterpolationRange range;
  Vec2 pb;
  Vec2 pa;
  float wb;
  float wa;
  int lineNdx;
  PixelBufferAccess local_4f0;
  undefined1 local_4c4 [24];
  int coverage;
  int dx;
  int dy;
  vector<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
  candidates;
  IVec3 formatLimit;
  uint uStack_47c;
  bool matchFound;
  int lineSurroundingCoverage;
  int lineCoverageSet;
  IVec3 pixelNativeColor;
  RGBA color;
  int x;
  int y;
  MessageBuilder local_438;
  MessageBuilder local_2b8;
  Vector<float,_4> local_138;
  PixelBufferAccess local_128;
  Vector<int,_4> local_100;
  PixelBufferAccess local_f0;
  TextureFormat local_c8;
  undefined1 local_c0 [8];
  TextureLevel referenceLineMap;
  allocator<tcu::Vector<float,_4>_> local_81;
  undefined1 local_80 [8];
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> screenspaceLines;
  undefined1 local_60 [4];
  int invalidPixels;
  Surface errorMask;
  int errorCount;
  int errorFloodThreshold;
  IVec2 viewportSize;
  RGBA invalidPixelColor;
  LineInterpolationMethod interpolationMethod_local;
  TestLog *log_local;
  RasterizationArguments *args_local;
  LineSceneSpec *scene_local;
  Surface *surface_local;
  
  viewportSize.m_data[1] = interpolationMethod;
  RGBA::RGBA((RGBA *)&viewportSize,0xff,0,0,0xff);
  iVar3 = Surface::getWidth(surface);
  iVar4 = Surface::getHeight(surface);
  Vector<int,_2>::Vector((Vector<int,_2> *)&errorCount,iVar3,iVar4);
  errorMask.m_pixels.m_cap._4_4_ = 4;
  errorMask.m_pixels.m_cap._0_4_ = 0;
  iVar3 = Surface::getWidth(surface);
  iVar4 = Surface::getHeight(surface);
  Surface::Surface((Surface *)local_60,iVar3,iVar4);
  screenspaceLines.
  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  sVar5 = std::vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
          ::size(&scene->lines);
  std::allocator<tcu::Vector<float,_4>_>::allocator(&local_81);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_80,
             sVar5,&local_81);
  std::allocator<tcu::Vector<float,_4>_>::~allocator(&local_81);
  TextureFormat::TextureFormat(&local_c8,R,UNSIGNED_INT8);
  iVar3 = Surface::getWidth(surface);
  iVar4 = Surface::getHeight(surface);
  TextureLevel::TextureLevel((TextureLevel *)local_c0,&local_c8,iVar3,iVar4,1);
  TextureLevel::getAccess(&local_f0,(TextureLevel *)local_c0);
  Vector<int,_4>::Vector(&local_100,0,0,0,0);
  tcu::clear(&local_f0,&local_100);
  Surface::getAccess(&local_128,(Surface *)local_60);
  Vector<float,_4>::Vector(&local_138,0.0,0.0,0.0,1.0);
  tcu::clear(&local_128,&local_138);
  TestLog::operator<<(&local_2b8,log,(BeginMessageToken *)&TestLog::Message);
  pMVar6 = MessageBuilder::operator<<
                     (&local_2b8,
                      (char (*) [53])"Verifying rasterization result. Native format is RGB");
  pMVar6 = MessageBuilder::operator<<(pMVar6,&args->redBits);
  pMVar6 = MessageBuilder::operator<<(pMVar6,&args->greenBits);
  pMVar6 = MessageBuilder::operator<<(pMVar6,&args->blueBits);
  MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
  MessageBuilder::~MessageBuilder(&local_2b8);
  if (((8 < args->redBits) || (8 < args->greenBits)) || (8 < args->blueBits)) {
    TestLog::operator<<(&local_438,log,(BeginMessageToken *)&TestLog::Message);
    pMVar6 = MessageBuilder::operator<<
                       (&local_438,
                        (char (*) [80])
                        "Warning! More than 8 bits in a color channel, this may produce false negatives."
                       );
    MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder(&local_438);
  }
  genScreenSpaceLines((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                      local_80,&scene->lines,(IVec2 *)&errorCount);
  fVar14 = scene->lineWidth;
  TextureLevel::getAccess((PixelBufferAccess *)&x,(TextureLevel *)local_c0);
  setMaskMapCoverageBitForLines
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_80,
             fVar14,(PixelBufferAccess *)&x);
  color.m_value = 1;
  do {
    RVar2.m_value = color.m_value;
    iVar3 = Surface::getHeight(surface);
    if (iVar3 + -1 <= (int)RVar2.m_value) {
      if (4 < (int)errorMask.m_pixels.m_cap) {
        TestLog::operator<<(&local_b80,log,(BeginMessageToken *)&TestLog::Message);
        pMVar6 = MessageBuilder::operator<<(&local_b80,(char (*) [9])"Omitted ");
        local_b84 = (int)errorMask.m_pixels.m_cap + -4;
        pMVar6 = MessageBuilder::operator<<(pMVar6,&local_b84);
        pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [29])" pixel error description(s).");
        MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
        MessageBuilder::~MessageBuilder(&local_b80);
      }
      bVar13 = screenspaceLines.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == 0;
      if (bVar13) {
        TestLog::operator<<(&local_10d8,log,(BeginMessageToken *)&TestLog::Message);
        pMVar6 = MessageBuilder::operator<<(&local_10d8,(char (*) [25])"No invalid pixels found.");
        MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
        MessageBuilder::~MessageBuilder(&local_10d8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1138,"Verification result",&local_1139);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1160,"Result of rendering",&local_1161);
        LogImageSet::LogImageSet(&local_1118,&local_1138,&local_1160);
        pTVar12 = TestLog::operator<<(log,&local_1118);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1218,"Result",&local_1219);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1240,"Result",&local_1241);
        LogImage::LogImage(&local_11f8,&local_1218,&local_1240,surface,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar12 = TestLog::operator<<(pTVar12,&local_11f8);
        TestLog::operator<<(pTVar12,(EndImageSetToken *)&TestLog::EndImageSet);
        LogImage::~LogImage(&local_11f8);
        std::__cxx11::string::~string((string *)&local_1240);
        std::allocator<char>::~allocator(&local_1241);
        std::__cxx11::string::~string((string *)&local_1218);
        std::allocator<char>::~allocator(&local_1219);
        LogImageSet::~LogImageSet(&local_1118);
        std::__cxx11::string::~string((string *)&local_1160);
        std::allocator<char>::~allocator(&local_1161);
        std::__cxx11::string::~string((string *)&local_1138);
        std::allocator<char>::~allocator(&local_1139);
      }
      else {
        TestLog::operator<<(&local_d08,log,(BeginMessageToken *)&TestLog::Message);
        pMVar6 = MessageBuilder::operator<<
                           (&local_d08,
                            (int *)((long)&screenspaceLines.
                                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
        pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [25])" invalid pixel(s) found.");
        MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
        MessageBuilder::~MessageBuilder(&local_d08);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d68,"Verification result",&local_d69);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d90,"Result of rendering",&local_d91);
        LogImageSet::LogImageSet(&local_d48,&local_d68,&local_d90);
        pTVar12 = TestLog::operator<<(log,&local_d48);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e48,"Result",&local_e49)
        ;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_e70,"Result",&local_e71)
        ;
        LogImage::LogImage(&local_e28,&local_e48,&local_e70,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar12 = TestLog::operator<<(pTVar12,&local_e28);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f28,"ErrorMask",&local_f29);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f50,"ErrorMask",&local_f51);
        LogImage::LogImage(&local_f08,&local_f28,&local_f50,(Surface *)local_60,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
        pTVar12 = TestLog::operator<<(pTVar12,&local_f08);
        TestLog::operator<<(pTVar12,(EndImageSetToken *)&TestLog::EndImageSet);
        LogImage::~LogImage(&local_f08);
        std::__cxx11::string::~string((string *)&local_f50);
        std::allocator<char>::~allocator(&local_f51);
        std::__cxx11::string::~string((string *)&local_f28);
        std::allocator<char>::~allocator(&local_f29);
        LogImage::~LogImage(&local_e28);
        std::__cxx11::string::~string((string *)&local_e70);
        std::allocator<char>::~allocator(&local_e71);
        std::__cxx11::string::~string((string *)&local_e48);
        std::allocator<char>::~allocator(&local_e49);
        LogImageSet::~LogImageSet(&local_d48);
        std::__cxx11::string::~string((string *)&local_d90);
        std::allocator<char>::~allocator(&local_d91);
        std::__cxx11::string::~string((string *)&local_d68);
        std::allocator<char>::~allocator(&local_d69);
      }
      TextureLevel::~TextureLevel((TextureLevel *)local_c0);
      std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
                ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_80)
      ;
      Surface::~Surface((Surface *)local_60);
      return bVar13;
    }
    for (pixelNativeColor.m_data[2] = 1; iVar3 = pixelNativeColor.m_data[2],
        iVar4 = Surface::getWidth(surface), iVar3 < iVar4 + -1;
        pixelNativeColor.m_data[2] = pixelNativeColor.m_data[2] + 1) {
      pixelNativeColor.m_data[1] =
           (int)Surface::getPixel(surface,pixelNativeColor.m_data[2],color.m_value);
      convertRGB8ToNativeFormat
                ((anon_unknown_3 *)&lineSurroundingCoverage,(RGBA *)(pixelNativeColor.m_data + 1),
                 args);
      uStack_47c = 0;
      formatLimit.m_data[2] = 0xffff;
      bVar13 = false;
      Vector<int,_3>::Vector
                ((Vector<int,_3> *)
                 &candidates.
                  super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (1 << ((byte)args->redBits & 0x1f)) + -1,(1 << ((byte)args->greenBits & 0x1f)) + -1
                 ,(1 << ((byte)args->blueBits & 0x1f)) + -1);
      std::
      vector<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
      ::vector((vector<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                *)&dx);
      for (coverage = -1; coverage < 2; coverage = coverage + 1) {
        for (local_4c4._20_4_ = -1; (int)local_4c4._20_4_ < 2;
            local_4c4._20_4_ = local_4c4._20_4_ + 1) {
          TextureLevel::getAccess(&local_4f0,(TextureLevel *)local_c0);
          ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_4c4,(int)&local_4f0,
                     pixelNativeColor.m_data[2] + local_4c4._20_4_,color.m_value + coverage);
          puVar7 = (uint *)Vector<int,_4>::x((Vector<int,_4> *)local_4c4);
          local_4c4._16_4_ = *puVar7;
          uStack_47c = local_4c4._16_4_ | uStack_47c;
          formatLimit.m_data[2] = local_4c4._16_4_ & formatLimit.m_data[2];
        }
      }
      local_12aa = false;
      if (formatLimit.m_data[2] == 0) {
        lineNdx = (int)RGBA::black();
        local_12aa = compareColors((RGBA *)(pixelNativeColor.m_data + 1),(RGBA *)&lineNdx,
                                   args->redBits,args->greenBits,args->blueBits);
      }
      if (local_12aa == false) {
        for (wb = 0.0;
            sVar5 = std::
                    vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                    ::size(&scene->lines), (int)wb < (int)sVar5; wb = (float)((int)wb + 1)) {
          if (((int)uStack_47c >> (SUB41(wb,0) & 0x1f) & 1U) != 0) {
            pvVar8 = std::
                     vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                     ::operator[](&scene->lines,(long)(int)wb);
            fVar14 = Vector<float,_4>::w(pvVar8->positions);
            pvVar8 = std::
                     vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                     ::operator[](&scene->lines,(long)(int)wb);
            fVar15 = Vector<float,_4>::w(pvVar8->positions + 1);
            pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                     operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 *)local_80,(long)(int)wb);
            Vector<float,_4>::swizzle((Vector<float,_4> *)&pb,(int)pvVar9,0);
            pvVar9 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
                     operator[]((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                 *)local_80,(long)(int)wb);
            Vector<float,_4>::swizzle((Vector<float,_4> *)&range.min,(int)pvVar9,2);
            if (viewportSize.m_data[1] == 0) {
              Vector<int,_2>::Vector(&local_52c,pixelNativeColor.m_data[2],color.m_value);
              calcSingleSampleLineInterpolationRange
                        ((anon_unknown_3 *)&local_524,&pb,fVar14,&range.min,fVar15,&local_52c,
                         args->subpixelBits);
            }
            else {
              Vector<int,_2>::Vector
                        ((Vector<int,_2> *)(valueMin.m_data + 2),pixelNativeColor.m_data[2],
                         color.m_value);
              calcSingleSampleLineInterpolationRangeAxisProjected
                        ((anon_unknown_3 *)&local_524,&pb,fVar14,&range.min,fVar15,
                         (IVec2 *)(valueMin.m_data + 2),args->subpixelBits);
            }
            fVar14 = Vector<float,_2>::x(&range.max);
            fVar14 = de::clamp<float>(fVar14,0.0,1.0);
            pvVar8 = std::
                     vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                     ::operator[](&scene->lines,(long)(int)wb);
            tcu::operator*((tcu *)&local_554,fVar14,pvVar8->colors);
            fVar14 = Vector<float,_2>::y(&range.max);
            fVar14 = de::clamp<float>(fVar14,0.0,1.0);
            pvVar8 = std::
                     vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                     ::operator[](&scene->lines,(long)(int)wb);
            tcu::operator*((tcu *)(valueMax.m_data + 2),fVar14,pvVar8->colors + 1);
            tcu::operator+((tcu *)local_544,&local_554,(Vector<float,_4> *)(valueMax.m_data + 2));
            fVar14 = Vector<float,_2>::x(&local_524);
            fVar14 = de::clamp<float>(fVar14,0.0,1.0);
            pvVar8 = std::
                     vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                     ::operator[](&scene->lines,(long)(int)wb);
            tcu::operator*((tcu *)&local_584,fVar14,pvVar8->colors);
            fVar14 = Vector<float,_2>::y(&local_524);
            fVar14 = de::clamp<float>(fVar14,0.0,1.0);
            pvVar8 = std::
                     vector<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                     ::operator[](&scene->lines,(long)(int)wb);
            tcu::operator*((tcu *)(colorMinF.m_data + 1),fVar14,pvVar8->colors + 1);
            tcu::operator+((tcu *)local_574,&local_584,(Vector<float,_4> *)(colorMinF.m_data + 1));
            fVar14 = Vector<float,_4>::x((Vector<float,_4> *)local_544);
            ppSVar1 = &candidates.
                       super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            iVar3 = Vector<int,_3>::x((Vector<int,_3> *)ppSVar1);
            iVar4 = Vector<int,_3>::x((Vector<int,_3> *)ppSVar1);
            fVar14 = de::clamp<float>(fVar14 * (float)iVar3,0.0,(float)iVar4);
            fVar15 = Vector<float,_4>::y((Vector<float,_4> *)local_544);
            ppSVar1 = &candidates.
                       super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            iVar3 = Vector<int,_3>::y((Vector<int,_3> *)ppSVar1);
            iVar4 = Vector<int,_3>::y((Vector<int,_3> *)ppSVar1);
            fVar15 = de::clamp<float>(fVar15 * (float)iVar3,0.0,(float)iVar4);
            fVar16 = Vector<float,_4>::z((Vector<float,_4> *)local_544);
            ppSVar1 = &candidates.
                       super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            iVar3 = Vector<int,_3>::z((Vector<int,_3> *)ppSVar1);
            iVar4 = Vector<int,_3>::z((Vector<int,_3> *)ppSVar1);
            fVar16 = de::clamp<float>(fVar16 * (float)iVar3,0.0,(float)iVar4);
            Vector<float,_3>::Vector
                      ((Vector<float,_3> *)(colorMaxF.m_data + 1),fVar14,fVar15,fVar16);
            fVar14 = Vector<float,_4>::x((Vector<float,_4> *)local_574);
            ppSVar1 = &candidates.
                       super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            iVar3 = Vector<int,_3>::x((Vector<int,_3> *)ppSVar1);
            iVar4 = Vector<int,_3>::x((Vector<int,_3> *)ppSVar1);
            fVar14 = de::clamp<float>(fVar14 * (float)iVar3,0.0,(float)iVar4);
            fVar15 = Vector<float,_4>::y((Vector<float,_4> *)local_574);
            ppSVar1 = &candidates.
                       super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            iVar3 = Vector<int,_3>::y((Vector<int,_3> *)ppSVar1);
            iVar4 = Vector<int,_3>::y((Vector<int,_3> *)ppSVar1);
            fVar15 = de::clamp<float>(fVar15 * (float)iVar3,0.0,(float)iVar4);
            fVar16 = Vector<float,_4>::z((Vector<float,_4> *)local_574);
            ppSVar1 = &candidates.
                       super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage;
            iVar3 = Vector<int,_3>::z((Vector<int,_3> *)ppSVar1);
            iVar4 = Vector<int,_3>::z((Vector<int,_3> *)ppSVar1);
            fVar16 = de::clamp<float>(fVar16 * (float)iVar3,0.0,(float)iVar4);
            Vector<float,_3>::Vector((Vector<float,_3> *)(colorMin.m_data + 1),fVar14,fVar15,fVar16)
            ;
            fVar14 = Vector<float,_3>::x((Vector<float,_3> *)(colorMaxF.m_data + 1));
            fVar14 = ::deFloatFloor(fVar14);
            fVar15 = Vector<float,_3>::y((Vector<float,_3> *)(colorMaxF.m_data + 1));
            fVar15 = ::deFloatFloor(fVar15);
            fVar16 = Vector<float,_3>::z((Vector<float,_3> *)(colorMaxF.m_data + 1));
            fVar16 = ::deFloatFloor(fVar16);
            Vector<int,_3>::Vector
                      ((Vector<int,_3> *)(colorMax.m_data + 1),(int)fVar14,(int)fVar15,(int)fVar16);
            fVar14 = Vector<float,_3>::x((Vector<float,_3> *)(colorMin.m_data + 1));
            fVar14 = ::deFloatCeil(fVar14);
            fVar15 = Vector<float,_3>::y((Vector<float,_3> *)(colorMin.m_data + 1));
            fVar15 = ::deFloatCeil(fVar15);
            fVar16 = Vector<float,_3>::z((Vector<float,_3> *)(colorMin.m_data + 1));
            fVar16 = ::deFloatCeil(fVar16);
            Vector<int,_3>::Vector
                      ((Vector<int,_3> *)(candidate.valueRangeMax.m_data + 1),(int)fVar14,
                       (int)fVar15,(int)fVar16);
            iVar3 = Vector<int,_3>::x((Vector<int,_3> *)&lineSurroundingCoverage);
            iVar4 = Vector<int,_3>::x((Vector<int,_3> *)(colorMax.m_data + 1));
            if (iVar4 <= iVar3) {
              iVar3 = Vector<int,_3>::y((Vector<int,_3> *)&lineSurroundingCoverage);
              iVar4 = Vector<int,_3>::y((Vector<int,_3> *)(colorMax.m_data + 1));
              if (iVar4 <= iVar3) {
                iVar3 = Vector<int,_3>::z((Vector<int,_3> *)&lineSurroundingCoverage);
                iVar4 = Vector<int,_3>::z((Vector<int,_3> *)(colorMax.m_data + 1));
                if (iVar4 <= iVar3) {
                  iVar3 = Vector<int,_3>::x((Vector<int,_3> *)&lineSurroundingCoverage);
                  iVar4 = Vector<int,_3>::x((Vector<int,_3> *)(candidate.valueRangeMax.m_data + 1));
                  if (iVar3 <= iVar4) {
                    iVar3 = Vector<int,_3>::y((Vector<int,_3> *)&lineSurroundingCoverage);
                    iVar4 = Vector<int,_3>::y((Vector<int,_3> *)(candidate.valueRangeMax.m_data + 1)
                                             );
                    if (iVar3 <= iVar4) {
                      iVar3 = Vector<int,_3>::z((Vector<int,_3> *)&lineSurroundingCoverage);
                      iVar4 = Vector<int,_3>::z((Vector<int,_3> *)
                                                (candidate.valueRangeMax.m_data + 1));
                      if (iVar3 <= iVar4) {
                        bVar13 = true;
                        break;
                      }
                    }
                  }
                }
              }
            }
            if ((int)errorMask.m_pixels.m_cap < 4) {
              SingleSampleNarrowLineCandidate::SingleSampleNarrowLineCandidate
                        ((SingleSampleNarrowLineCandidate *)local_610);
              local_610._0_4_ = wb;
              candidate.colorMin.m_data[0] = colorMin.m_data[0];
              local_610._4_4_ = colorMax.m_data[1];
              candidate.lineNdx = colorMax.m_data[2];
              candidate.colorMax.m_data[0] = colorMax.m_data[0];
              candidate.colorMin.m_data[1] = (int)candidate.valueRangeMax.m_data[1];
              candidate.colorMin.m_data[2] = (int)candidate.valueRangeMax.m_data[2];
              candidate.colorMinF.m_data[0] = colorMinF.m_data[0];
              candidate.colorMax.m_data[1] = (int)colorMaxF.m_data[1];
              candidate.colorMax.m_data[2] = (int)colorMaxF.m_data[2];
              candidate.colorMaxF.m_data[0] = colorMaxF.m_data[0];
              candidate.colorMinF.m_data[1] = (float)colorMin.m_data[1];
              candidate.colorMinF.m_data[2] = (float)colorMin.m_data[2];
              Vector<float,_4>::swizzle((Vector<float,_4> *)(local_628 + 0xc),(int)local_544,0,1);
              candidate.valueRangeMin.m_data[0] = local_614;
              candidate.colorMaxF.m_data[1] = (float)local_628._12_4_;
              candidate.colorMaxF.m_data[2] = (float)local_628._16_4_;
              Vector<float,_4>::swizzle((Vector<float,_4> *)local_628,(int)local_574,0,1);
              candidate.valueRangeMax.m_data[0] = (float)local_628._8_4_;
              candidate.valueRangeMin.m_data[1] = (float)local_628._0_4_;
              candidate.valueRangeMin.m_data[2] = (float)local_628._4_4_;
              std::
              vector<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
              ::push_back((vector<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                           *)&dx,(value_type *)local_610);
            }
          }
        }
        if (!bVar13) {
          screenspaceLines.
          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl
          .super__Vector_impl_data._M_end_of_storage._4_4_ =
               screenspaceLines.
               super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
          local_62c = viewportSize.m_data[0];
          Surface::setPixel((Surface *)local_60,pixelNativeColor.m_data[2],color.m_value,
                            (RGBA)viewportSize.m_data[0]);
          errorMask.m_pixels.m_cap._0_4_ = (int)errorMask.m_pixels.m_cap + 1;
          if ((int)errorMask.m_pixels.m_cap < 4) {
            TestLog::operator<<((MessageBuilder *)&candidateNdx,log,
                                (BeginMessageToken *)&TestLog::Message);
            pMVar6 = MessageBuilder::operator<<
                               ((MessageBuilder *)&candidateNdx,
                                (char (*) [28])"Found an invalid pixel at (");
            pMVar6 = MessageBuilder::operator<<(pMVar6,pixelNativeColor.m_data + 2);
            pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0xafd6ae);
            pMVar6 = MessageBuilder::operator<<(pMVar6,(int *)&color);
            pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [4])0xafd70e);
            sVar5 = std::
                    vector<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                    ::size((vector<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                            *)&dx);
            candidate_1._4_4_ = (undefined4)sVar5;
            pMVar6 = MessageBuilder::operator<<(pMVar6,(int *)((long)&candidate_1 + 4));
            pMVar6 = MessageBuilder::operator<<
                               (pMVar6,(char (*) [38])" candidate reference value(s) found:\n");
            pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [16])"\tPixel color:\t\t");
            pMVar6 = MessageBuilder::operator<<(pMVar6,(RGBA *)(pixelNativeColor.m_data + 1));
            pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0xaed5b8);
            pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [17])"\tNative color:\t\t");
            pMVar6 = MessageBuilder::operator<<(pMVar6,(Vector<int,_3> *)&lineSurroundingCoverage);
            pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0xaed5b8);
            MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
            MessageBuilder::~MessageBuilder((MessageBuilder *)&candidateNdx);
            for (candidate_1._0_4_ = 0; iVar3 = (int)candidate_1,
                sVar5 = std::
                        vector<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                        ::size((vector<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                                *)&dx), iVar3 < (int)sVar5; candidate_1._0_4_ = (int)candidate_1 + 1
                ) {
              local_7c0 = std::
                          vector<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                          ::operator[]((vector<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                                        *)&dx,(long)(int)candidate_1);
              TestLog::operator<<(&local_940,log,(BeginMessageToken *)&TestLog::Message);
              pMVar6 = MessageBuilder::operator<<(&local_940,(char (*) [18])"\tCandidate (line ");
              pMVar6 = MessageBuilder::operator<<(pMVar6,&local_7c0->lineNdx);
              pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [4])0xaf35f6);
              pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [31])0xb1b821);
              pIVar10 = &local_7c0->colorMin;
              Vector<int,_3>::Vector(&local_958,0,0,0);
              clamp<int,3>((tcu *)&local_94c,pIVar10,&local_958,
                           (Vector<int,_3> *)
                           &candidates.
                            super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
              pMVar6 = MessageBuilder::operator<<(pMVar6,&local_94c);
              pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0xaed5b8);
              pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [31])0xb1b841);
              pIVar10 = &local_7c0->colorMax;
              Vector<int,_3>::Vector(&local_970,0,0,0);
              clamp<int,3>((tcu *)&local_964,pIVar10,&local_970,
                           (Vector<int,_3> *)
                           &candidates.
                            super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
              pMVar6 = MessageBuilder::operator<<(pMVar6,&local_964);
              pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0xaed5b8);
              pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [31])0xb1b861);
              pVVar11 = &local_7c0->colorMinF;
              Vector<float,_3>::Vector(&local_988,0.0,0.0,0.0);
              Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_994);
              clamp<float,3>((tcu *)&local_97c,pVVar11,&local_988,&local_994);
              pMVar6 = MessageBuilder::operator<<(pMVar6,&local_97c);
              pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0xaed5b8);
              pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [31])0xb1b881);
              pVVar11 = &local_7c0->colorMaxF;
              Vector<float,_3>::Vector(&local_9ac,0.0,0.0,0.0);
              Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_9b8);
              clamp<float,3>((tcu *)&local_9a0,pVVar11,&local_9ac,&local_9b8);
              pMVar6 = MessageBuilder::operator<<(pMVar6,&local_9a0);
              pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0xaed5b8);
              pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [9])0xb1b8a1);
              pVVar11 = &local_7c0->valueRangeMin;
              Vector<float,_3>::Vector(&local_9d0,0.0,0.0,0.0);
              Vector<float,_3>::Vector(&local_9dc,1.0,1.0,1.0);
              clamp<float,3>((tcu *)&local_9c4,pVVar11,&local_9d0,&local_9dc);
              pMVar6 = MessageBuilder::operator<<(pMVar6,&local_9c4);
              pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0xaed5b8);
              pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [9])0xb1b8ab);
              pVVar11 = &local_7c0->valueRangeMax;
              Vector<float,_3>::Vector(&local_9f4,0.0,0.0,0.0);
              Vector<float,_3>::Vector(&local_a00,1.0,1.0,1.0);
              clamp<float,3>((tcu *)&local_9e8,pVVar11,&local_9f4,&local_a00);
              pMVar6 = MessageBuilder::operator<<(pMVar6,&local_9e8);
              pMVar6 = MessageBuilder::operator<<(pMVar6,(char (*) [2])0xaed5b8);
              MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&TestLog::EndMessage);
              MessageBuilder::~MessageBuilder(&local_940);
            }
          }
        }
      }
      std::
      vector<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
      ::~vector((vector<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                 *)&dx);
    }
    color.m_value = color.m_value + 1;
  } while( true );
}

Assistant:

bool verifyLineGroupPixelIndependentInterpolation (const tcu::Surface&				surface,
												   const LineSceneSpec&				scene,
												   const RasterizationArguments&	args,
												   tcu::TestLog&					log,
												   LineInterpolationMethod			interpolationMethod)
{
	DE_ASSERT(scene.lines.size() < 8); // coverage indices are stored as bitmask in a unsigned 8-bit ints
	DE_ASSERT(interpolationMethod == LINEINTERPOLATION_STRICTLY_CORRECT || interpolationMethod == LINEINTERPOLATION_PROJECTED);

	const tcu::RGBA			invalidPixelColor	= tcu::RGBA(255, 0, 0, 255);
	const tcu::IVec2		viewportSize		= tcu::IVec2(surface.getWidth(), surface.getHeight());
	const int				errorFloodThreshold	= 4;
	int						errorCount			= 0;
	tcu::Surface			errorMask			(surface.getWidth(), surface.getHeight());
	int						invalidPixels		= 0;
	std::vector<tcu::Vec4>	screenspaceLines	(scene.lines.size()); //!< packed (x0, y0, x1, y1)

	// Reference renderer produces correct fragments using the diamond-exit-rule. Make 2D int array, store line coverage as a 8-bit bitfield
	// The map is used to find lines with potential coverage to a given pixel
	tcu::TextureLevel		referenceLineMap	(tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT8), surface.getWidth(), surface.getHeight());

	tcu::clear(referenceLineMap.getAccess(), tcu::IVec4(0, 0, 0, 0));
	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	// log format

	log << tcu::TestLog::Message << "Verifying rasterization result. Native format is RGB" << args.redBits << args.greenBits << args.blueBits << tcu::TestLog::EndMessage;
	if (args.redBits > 8 || args.greenBits > 8 || args.blueBits > 8)
		log << tcu::TestLog::Message << "Warning! More than 8 bits in a color channel, this may produce false negatives." << tcu::TestLog::EndMessage;

	// prepare lookup map

	genScreenSpaceLines(screenspaceLines, scene.lines, viewportSize);
	setMaskMapCoverageBitForLines(screenspaceLines, scene.lineWidth, referenceLineMap.getAccess());

	// Find all possible lines with coverage, check pixel color matches one of them

	for (int y = 1; y < surface.getHeight() - 1; ++y)
	for (int x = 1; x < surface.getWidth()  - 1; ++x)
	{
		const tcu::RGBA		color					= surface.getPixel(x, y);
		const tcu::IVec3	pixelNativeColor		= convertRGB8ToNativeFormat(color, args);	// Convert pixel color from rgba8 to the real pixel format. Usually rgba8 or 565
		int					lineCoverageSet			= 0;										// !< lines that may cover this fragment
		int					lineSurroundingCoverage = 0xFFFF;									// !< lines that will cover this fragment
		bool				matchFound				= false;
		const tcu::IVec3	formatLimit				((1 << args.redBits) - 1, (1 << args.greenBits) - 1, (1 << args.blueBits) - 1);

		std::vector<SingleSampleNarrowLineCandidate> candidates;

		// Find lines with possible coverage

		for (int dy = -1; dy < 2; ++dy)
		for (int dx = -1; dx < 2; ++dx)
		{
			const int coverage = referenceLineMap.getAccess().getPixelInt(x+dx, y+dy).x();

			lineCoverageSet			|= coverage;
			lineSurroundingCoverage	&= coverage;
		}

		// background color is possible?
		if (lineSurroundingCoverage == 0 && compareColors(color, tcu::RGBA::black(), args.redBits, args.greenBits, args.blueBits))
			continue;

		// Check those lines

		for (int lineNdx = 0; lineNdx < (int)scene.lines.size(); ++lineNdx)
		{
			if (((lineCoverageSet >> lineNdx) & 0x01) != 0)
			{
				const float						wa				= scene.lines[lineNdx].positions[0].w();
				const float						wb				= scene.lines[lineNdx].positions[1].w();
				const tcu::Vec2					pa				= screenspaceLines[lineNdx].swizzle(0, 1);
				const tcu::Vec2					pb				= screenspaceLines[lineNdx].swizzle(2, 3);

				const LineInterpolationRange	range			= (interpolationMethod == LINEINTERPOLATION_STRICTLY_CORRECT)
																	? (calcSingleSampleLineInterpolationRange(pa, wa, pb, wb, tcu::IVec2(x, y), args.subpixelBits))
																	: (calcSingleSampleLineInterpolationRangeAxisProjected(pa, wa, pb, wb, tcu::IVec2(x, y), args.subpixelBits));

				const tcu::Vec4					valueMin		= de::clamp(range.min.x(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[0] + de::clamp(range.min.y(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[1];
				const tcu::Vec4					valueMax		= de::clamp(range.max.x(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[0] + de::clamp(range.max.y(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[1];

				const tcu::Vec3					colorMinF		(de::clamp(valueMin.x() * (float)formatLimit.x(), 0.0f, (float)formatLimit.x()),
																 de::clamp(valueMin.y() * (float)formatLimit.y(), 0.0f, (float)formatLimit.y()),
																 de::clamp(valueMin.z() * (float)formatLimit.z(), 0.0f, (float)formatLimit.z()));
				const tcu::Vec3					colorMaxF		(de::clamp(valueMax.x() * (float)formatLimit.x(), 0.0f, (float)formatLimit.x()),
																 de::clamp(valueMax.y() * (float)formatLimit.y(), 0.0f, (float)formatLimit.y()),
																 de::clamp(valueMax.z() * (float)formatLimit.z(), 0.0f, (float)formatLimit.z()));
				const tcu::IVec3				colorMin		((int)deFloatFloor(colorMinF.x()),
																 (int)deFloatFloor(colorMinF.y()),
																 (int)deFloatFloor(colorMinF.z()));
				const tcu::IVec3				colorMax		((int)deFloatCeil (colorMaxF.x()),
																 (int)deFloatCeil (colorMaxF.y()),
																 (int)deFloatCeil (colorMaxF.z()));

				// Verify validity
				if (pixelNativeColor.x() < colorMin.x() ||
					pixelNativeColor.y() < colorMin.y() ||
					pixelNativeColor.z() < colorMin.z() ||
					pixelNativeColor.x() > colorMax.x() ||
					pixelNativeColor.y() > colorMax.y() ||
					pixelNativeColor.z() > colorMax.z())
				{
					if (errorCount < errorFloodThreshold)
					{
						// Store candidate information for logging
						SingleSampleNarrowLineCandidate candidate;

						candidate.lineNdx		= lineNdx;
						candidate.colorMin		= colorMin;
						candidate.colorMax		= colorMax;
						candidate.colorMinF		= colorMinF;
						candidate.colorMaxF		= colorMaxF;
						candidate.valueRangeMin	= valueMin.swizzle(0, 1, 2);
						candidate.valueRangeMax	= valueMax.swizzle(0, 1, 2);

						candidates.push_back(candidate);
					}
				}
				else
				{
					matchFound = true;
					break;
				}
			}
		}

		if (matchFound)
			continue;

		// invalid fragment
		++invalidPixels;
		errorMask.setPixel(x, y, invalidPixelColor);

		++errorCount;

		// don't fill the logs with too much data
		if (errorCount < errorFloodThreshold)
		{
			log << tcu::TestLog::Message
				<< "Found an invalid pixel at (" << x << "," << y << "), " << (int)candidates.size() << " candidate reference value(s) found:\n"
				<< "\tPixel color:\t\t" << color << "\n"
				<< "\tNative color:\t\t" << pixelNativeColor << "\n"
				<< tcu::TestLog::EndMessage;

			for (int candidateNdx = 0; candidateNdx < (int)candidates.size(); ++candidateNdx)
			{
				const SingleSampleNarrowLineCandidate& candidate = candidates[candidateNdx];

				log << tcu::TestLog::Message << "\tCandidate (line " << candidate.lineNdx << "):\n"
					<< "\t\tReference native color min: " << tcu::clamp(candidate.colorMin, tcu::IVec3(0,0,0), formatLimit) << "\n"
					<< "\t\tReference native color max: " << tcu::clamp(candidate.colorMax, tcu::IVec3(0,0,0), formatLimit) << "\n"
					<< "\t\tReference native float min: " << tcu::clamp(candidate.colorMinF, tcu::Vec3(0.0f, 0.0f, 0.0f), formatLimit.cast<float>()) << "\n"
					<< "\t\tReference native float max: " << tcu::clamp(candidate.colorMaxF, tcu::Vec3(0.0f, 0.0f, 0.0f), formatLimit.cast<float>()) << "\n"
					<< "\t\tFmin:\t" << tcu::clamp(candidate.valueRangeMin, tcu::Vec3(0.0f, 0.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 1.0f)) << "\n"
					<< "\t\tFmax:\t" << tcu::clamp(candidate.valueRangeMax, tcu::Vec3(0.0f, 0.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 1.0f)) << "\n"
					<< tcu::TestLog::EndMessage;
			}
		}
	}

	// don't just hide failures
	if (errorCount > errorFloodThreshold)
		log << tcu::TestLog::Message << "Omitted " << (errorCount-errorFloodThreshold) << " pixel error description(s)." << tcu::TestLog::EndMessage;

	// report result
	if (invalidPixels)
	{
		log << tcu::TestLog::Message << invalidPixels << " invalid pixel(s) found." << tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result", "Result",			surface)
			<< tcu::TestLog::Image("ErrorMask", "ErrorMask",	errorMask)
			<< tcu::TestLog::EndImageSet;

		return false;
	}
	else
	{
		log << tcu::TestLog::Message << "No invalid pixels found." << tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result", "Result", surface)
			<< tcu::TestLog::EndImageSet;

		return true;
	}
}